

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

void * mmap_checked(size_t size,size_t align,int flags)

{
  ulong size_00;
  size_t offset;
  void *map;
  int flags_local;
  size_t align_local;
  size_t size_local;
  
  if ((align & align - 1) != 0) {
    __assert_fail("(align & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0x5b,"void *mmap_checked(size_t, size_t, int)");
  }
  if ((size & align - 1) != 0) {
    __assert_fail("(size & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0x5d,"void *mmap_checked(size_t, size_t, int)");
  }
  if ((flags & 0x80000001U) == 0x80000001) {
    map._4_4_ = 0x22;
  }
  else {
    map._4_4_ = 0x21;
  }
  size_local = (size_t)mmap((void *)0x0,size,3,map._4_4_,-1,0);
  if ((void *)size_local == (void *)0xffffffffffffffff) {
    size_local = 0;
  }
  else if ((size_local & align - 1) != 0) {
    munmap_checked((void *)size_local,size);
    offset = (size_t)mmap((void *)0x0,size + align,3,map._4_4_,-1,0);
    if ((void *)offset == (void *)0xffffffffffffffff) {
      size_local = 0;
    }
    else {
      size_00 = offset & align - 1;
      if (size_00 == 0) {
        munmap_checked((void *)(offset + size),align);
      }
      else {
        munmap_checked((void *)offset,align - size_00);
        offset = (align - size_00) + offset;
        munmap_checked((void *)(offset + size),size_00);
      }
      size_local = offset;
    }
  }
  return (void *)size_local;
}

Assistant:

static void *
mmap_checked(size_t size, size_t align, int flags)
{
	/* The alignment must be a power of two. */
	assert((align & (align - 1)) == 0);
	/* The size must be a multiple of alignment */
	assert((size & (align - 1)) == 0);

	if (IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE))
		flags = MAP_PRIVATE | MAP_ANONYMOUS;
	else
		flags = MAP_SHARED | MAP_ANONYMOUS;

	/*
	 * All mappings except the first are likely to
	 * be aligned already.  Be optimistic by trying
	 * to map exactly the requested amount.
	 */
	void *map = mmap(NULL, size, PROT_READ | PROT_WRITE, flags, -1, 0);
	if (map == MAP_FAILED)
		return NULL;
	if (((intptr_t) map & (align - 1)) == 0)
		return map;
	munmap_checked(map, size);

	/*
	 * mmap enough amount to be able to align
	 * the mapped address.  This can lead to virtual memory
	 * fragmentation depending on the kernels allocation
	 * strategy.
	 */
	map = mmap(NULL, size + align, PROT_READ | PROT_WRITE, flags, -1, 0);
	if (map == MAP_FAILED)
		return NULL;

	/* Align the mapped address around slab size. */
	size_t offset = (intptr_t) map & (align - 1);

	if (offset != 0) {
		/* Unmap unaligned prefix and postfix. */
		munmap_checked(map, align - offset);
		map += align - offset;
		munmap_checked(map + size, offset);
	} else {
		/* The address is returned aligned. */
		munmap_checked(map + size, align);
	}
	return map;
}